

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void out_RegisterNode(FileStackNode *node)

{
  FileStackNode *pFVar1;
  uint32_t uVar2;
  FileStackNode *local_10;
  FileStackNode *node_local;
  
  pFVar1 = node;
  while( true ) {
    local_10 = pFVar1;
    if (local_10->ID != 0xffffffff) {
      return;
    }
    uVar2 = getNbFileStackNodes();
    local_10->ID = uVar2;
    if (local_10->ID == 0xffffffff) break;
    local_10->next = fileStackNodes;
    fileStackNodes = local_10;
    pFVar1 = local_10->parent;
    if (local_10->parent == (FileStackNode *)0x0) {
      return;
    }
  }
  fatalerror("Reached too many file stack nodes; try splitting the file up\n");
}

Assistant:

void out_RegisterNode(struct FileStackNode *node)
{
	// If node is not already registered, register it (and parents), and give it a unique ID
	while (node->ID == (uint32_t)-1) {
		node->ID = getNbFileStackNodes();
		if (node->ID == (uint32_t)-1)
			fatalerror("Reached too many file stack nodes; try splitting the file up\n");
		node->next = fileStackNodes;
		fileStackNodes = node;

		// Also register the node's parents
		node = node->parent;
		if (!node)
			break;
	}
}